

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_true>::push_block_
          (DaTrie<true,_false,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  reference pvVar2;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  DaTrie<true,_false,_true> *unaff_retaddr;
  uint32_t end;
  uint32_t begin;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t block_pos_00;
  
  block_pos_00 = (uint32_t)((ulong)in_RDI >> 0x20);
  uVar1 = in_ESI * 0x100;
  set_next_((DaTrie<true,_false,_true> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
            in_stack_ffffffffffffffc8);
  set_prev_((DaTrie<true,_false,_true> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
            in_stack_ffffffffffffffc8);
  pvVar2 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                     (in_RDX,(ulong)in_ESI);
  pvVar2->head = uVar1;
  insert_block_link_(unaff_retaddr,block_pos_00,
                     (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
                     CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void push_block_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;
    set_next_(end - 1, begin);
    set_prev_(begin, end - 1);

    blocks[block_pos].head = begin;
    insert_block_link_(block_pos, blocks);
  }